

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall PClass::InsertIntoHash(PClass *this)

{
  PType *pPVar1;
  size_t bucket;
  size_t local_10;
  
  pPVar1 = FTypeTable::FindType
                     (&TypeTable,RegistrationInfo.MyClass,
                      (intptr_t)(this->super_PNativeStruct).super_PStruct.super_PNamedType.Outer,
                      (long)(this->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.
                            Index,&local_10);
  if (pPVar1 == (PType *)0x0) {
    FTypeTable::AddType(&TypeTable,(PType *)this,RegistrationInfo.MyClass,
                        (intptr_t)(this->super_PNativeStruct).super_PStruct.super_PNamedType.Outer,
                        (long)(this->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.
                              Index,local_10);
  }
  else {
    I_Error("Tried to register class \'%s\' more than once.\n",
            FName::NameData.NameArray
            [(this->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index].Text);
  }
  return;
}

Assistant:

void PClass::InsertIntoHash ()
{
	size_t bucket;
	PType *found;

	found = TypeTable.FindType(RUNTIME_CLASS(PClass), (intptr_t)Outer, TypeName, &bucket);
	if (found != NULL)
	{ // This type has already been inserted
		I_Error("Tried to register class '%s' more than once.\n", TypeName.GetChars());
	}
	else
	{
		TypeTable.AddType(this, RUNTIME_CLASS(PClass), (intptr_t)Outer, TypeName, bucket);
	}
}